

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Matrix.c
# Opt level: O0

void Llb_MtrFree(Llb_Mtr_t *p)

{
  int local_14;
  int i;
  Llb_Mtr_t *p_local;
  
  if (p->pProdVars != (char *)0x0) {
    free(p->pProdVars);
    p->pProdVars = (char *)0x0;
  }
  if (p->pProdNums != (int *)0x0) {
    free(p->pProdNums);
    p->pProdNums = (int *)0x0;
  }
  for (local_14 = 0; local_14 < p->nCols; local_14 = local_14 + 1) {
    if (p->pMatrix[local_14] != (char *)0x0) {
      free(p->pMatrix[local_14]);
      p->pMatrix[local_14] = (char *)0x0;
    }
  }
  if (p->pRowSums != (int *)0x0) {
    free(p->pRowSums);
    p->pRowSums = (int *)0x0;
  }
  if (p->pColSums != (int *)0x0) {
    free(p->pColSums);
    p->pColSums = (int *)0x0;
  }
  if (p->pMatrix != (char **)0x0) {
    free(p->pMatrix);
    p->pMatrix = (char **)0x0;
  }
  if (p->pColGrps != (Llb_Grp_t **)0x0) {
    free(p->pColGrps);
    p->pColGrps = (Llb_Grp_t **)0x0;
  }
  if (p != (Llb_Mtr_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Llb_MtrFree( Llb_Mtr_t * p )
{
    int i;
    ABC_FREE( p->pProdVars );
    ABC_FREE( p->pProdNums );
    for ( i = 0; i < p->nCols; i++ )
        ABC_FREE( p->pMatrix[i] );
    ABC_FREE( p->pRowSums );
    ABC_FREE( p->pColSums );
    ABC_FREE( p->pMatrix );
    ABC_FREE( p->pColGrps );
    ABC_FREE( p );
}